

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_ecf33::SymlinkCommand::configureAttribute
          (SymlinkCommand *this,ConfigureContext *ctx,StringRef name,
          ArrayRef<std::pair<llvm::StringRef,_llvm::StringRef>_> values)

{
  Twine local_80;
  Twine local_68;
  Twine local_50;
  ConfigureContext *local_38;
  ConfigureContext *ctx_local;
  SymlinkCommand *this_local;
  ArrayRef<std::pair<llvm::StringRef,_llvm::StringRef>_> values_local;
  StringRef name_local;
  
  values_local.Data = (pair<llvm::StringRef,_llvm::StringRef> *)values.Length;
  this_local = (SymlinkCommand *)values.Data;
  values_local.Length = (size_type)name.Data;
  local_38 = ctx;
  ctx_local = (ConfigureContext *)this;
  llvm::operator+(&local_68,"unexpected attribute: \'",(StringRef *)&values_local.Length);
  llvm::Twine::Twine(&local_80,"\'");
  llvm::operator+(&local_50,&local_68,&local_80);
  llbuild::buildsystem::ConfigureContext::error(ctx,&local_50);
  return false;
}

Assistant:

virtual bool configureAttribute(
      const ConfigureContext& ctx, StringRef name,
      ArrayRef<std::pair<StringRef, StringRef>> values) override {
    // No supported attributes.
    ctx.error("unexpected attribute: '" + name + "'");
    return false;
  }